

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextDisabledV(char *fmt,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *local_38;
  ImGuiContext *g;
  __va_list_tag *args_local;
  char *fmt_local;
  
  PushStyleColor(0,(GImGui->Style).Colors + 1);
  if (((*fmt == '%') && (fmt[1] == 's')) && (fmt[2] == '\0')) {
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_38 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_38 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_38 + 1;
    }
    TextEx((char *)*local_38,(char *)0x0,1);
  }
  else {
    TextV(fmt,args);
  }
  PopStyleColor(1);
  return;
}

Assistant:

void ImGui::TextDisabledV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    PopStyleColor();
}